

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int fits_strcasecmp(char *s1,char *s2)

{
  uint uVar1;
  __int32_t *p_Var2;
  __int32_t **pp_Var3;
  long lVar4;
  char cVar5;
  char cVar6;
  
  pp_Var3 = __ctype_toupper_loc();
  p_Var2 = *pp_Var3;
  uVar1 = p_Var2[*s1];
  cVar5 = (char)p_Var2[*s2];
  cVar6 = (char)uVar1;
  if (cVar5 <= cVar6) {
    lVar4 = 1;
    do {
      if (cVar5 < cVar6) {
        return 1;
      }
      if ((uVar1 & 0xff) == 0) {
        return 0;
      }
      uVar1 = p_Var2[s1[lVar4]];
      cVar5 = (char)p_Var2[s2[lVar4]];
      cVar6 = (char)uVar1;
      lVar4 = lVar4 + 1;
    } while (cVar5 <= cVar6);
  }
  return -1;
}

Assistant:

int fits_strcasecmp(const char *s1, const char *s2)
{
   char c1, c2;

   for (;;) {
      c1 = toupper( *s1 );
      c2 = toupper( *s2 );

      if (c1 < c2) return(-1);
      if (c1 > c2) return(1);
      if (c1 == 0) return(0);
      s1++;
      s2++;
   }
}